

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CCallSimplifierVisitor.cpp
# Opt level: O3

void __thiscall
IRT::CCallSimplifierVisitor::Visit(CCallSimplifierVisitor *this,CMoveStatement *statement)

{
  CStatement *pCVar1;
  CExpression *pCVar2;
  CExpression *pCVar3;
  CMoveStatement *this_00;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_30;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_28;
  
  pCVar2 = CMoveStatement::Target(statement);
  (**(pCVar2->super_IExpression).super_INode._vptr_INode)(pCVar2,this);
  pCVar2 = (this->childExpression)._M_t.
           super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
           .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl;
  (this->childExpression)._M_t.
  super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>._M_t.
  super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>.
  super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl = (CExpression *)0x0;
  pCVar3 = CMoveStatement::Source(statement);
  (**(pCVar3->super_IExpression).super_INode._vptr_INode)(pCVar3,this);
  pCVar3 = (this->childExpression)._M_t.
           super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
           .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl;
  (this->childExpression)._M_t.
  super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>._M_t.
  super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>.
  super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl = (CExpression *)0x0;
  this_00 = (CMoveStatement *)operator_new(0x18);
  local_30._M_head_impl = pCVar3;
  local_28._M_head_impl = pCVar2;
  CMoveStatement::CMoveStatement
            (this_00,(unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                      *)&local_28,
             (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
             &local_30);
  pCVar1 = (this->childStatement)._M_t.
           super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>
           .super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl;
  (this->childStatement)._M_t.
  super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>._M_t.
  super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>.
  super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl = (CStatement *)this_00;
  if (pCVar1 != (CStatement *)0x0) {
    (**(code **)((long)(pCVar1->super_IStatement).super_INode + 0x10))();
  }
  if (local_30._M_head_impl != (CExpression *)0x0) {
    (*((local_30._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
  }
  local_30._M_head_impl = (CExpression *)0x0;
  if (local_28._M_head_impl != (CExpression *)0x0) {
    (*((local_28._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
  }
  return;
}

Assistant:

void IRT::CCallSimplifierVisitor::Visit(const CMoveStatement &statement) {
    statement.Target()->Accept(*this);
    std::unique_ptr<const CExpression> target = std::move(childExpression);

    statement.Source()->Accept(*this);
    std::unique_ptr<const CExpression> source = std::move(childExpression);

    childStatement = std::move(
            std::unique_ptr<const CStatement>(
                    new CMoveStatement(
                        std::move(target),
                        std::move(source)
                    )
            )
    );
}